

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_convert.c
# Opt level: O0

int mpt_value_convert(mpt_value *val,mpt_type_t type,void *dest)

{
  int iVar1;
  mpt_type_traits *pmVar2;
  char *pcVar3;
  uint local_7c;
  uint local_6c;
  char *str;
  iovec *vec;
  mpt_type_traits *traits_2;
  mpt_type_traits *traits_1;
  mpt_type_traits *traits;
  undefined8 *puStack_38;
  int ret;
  void *src;
  mpt_data_converter_t conv;
  void *dest_local;
  mpt_type_t type_local;
  mpt_value *val_local;
  
  puStack_38 = (undefined8 *)val->_addr;
  if (type == 0) {
    val_local._4_4_ = -1;
  }
  else {
    conv = (mpt_data_converter_t)dest;
    dest_local = (void *)type;
    type_local = (mpt_type_t)val;
    src = mpt_data_converter(val->_type);
    if (((mpt_data_converter_t)src == (mpt_data_converter_t)0x0) ||
       (iVar1 = (*(code *)src)(puStack_38,(mpt_type_t)dest_local,conv), iVar1 < 0)) {
      if (*(void **)(type_local + 8) == dest_local) {
        pmVar2 = mpt_type_traits((mpt_type_t)dest_local);
        if (pmVar2 == (mpt_type_traits *)0x0) {
          val_local._4_4_ = -1;
        }
        else if ((pmVar2->init == (_func_int_void_ptr_void_ptr *)0x0) &&
                (pmVar2->fini == (_func_void_void_ptr *)0x0)) {
          if (conv != (mpt_data_converter_t)0x0) {
            memcpy(conv,puStack_38,pmVar2->size);
          }
          val_local._4_4_ = 0;
        }
        else {
          val_local._4_4_ = -2;
        }
      }
      else {
        if (dest_local == (void *)0x40) {
          if ((*(ulong *)(type_local + 8) < 0x40) || (0x59 < *(ulong *)(type_local + 8))) {
            local_6c = 0;
          }
          else {
            local_6c = (uint)(byte)((char)*(undefined8 *)(type_local + 8) + 0x20);
          }
          if (local_6c != 0) {
            pmVar2 = mpt_type_traits((long)(int)local_6c);
            if (pmVar2 == (mpt_type_traits *)0x0) {
              return -1;
            }
            if ((pmVar2->init == (_func_int_void_ptr_void_ptr *)0x0) &&
               (pmVar2->fini == (_func_void_void_ptr *)0x0)) {
              if (conv != (mpt_data_converter_t)0x0) {
                *(undefined8 *)conv = *puStack_38;
                *(undefined8 *)(conv + 8) = puStack_38[1];
              }
              return 1;
            }
            return -2;
          }
        }
        if ((*(ulong *)(type_local + 8) < 0x60) || (0x7a < *(ulong *)(type_local + 8))) {
          local_7c = 0;
        }
        else {
          local_7c = (uint)(byte)((char)*(undefined8 *)(type_local + 8) - 0x20);
        }
        if (dest_local == (void *)(long)(int)local_7c) {
          pmVar2 = mpt_type_traits(*(mpt_type_t *)(type_local + 8));
          if (pmVar2 == (mpt_type_traits *)0x0) {
            val_local._4_4_ = -1;
          }
          else {
            if (conv != (mpt_data_converter_t)0x0) {
              *(undefined8 **)conv = puStack_38;
              *(size_t *)(conv + 8) = pmVar2->size;
            }
            val_local._4_4_ = 2;
          }
        }
        else if ((dest_local == (void *)0x73) &&
                (pcVar3 = mpt_data_tostring(&stack0xffffffffffffffc8,*(mpt_type_t *)(type_local + 8)
                                            ,(size_t *)0x0), pcVar3 != (char *)0x0)) {
          if (conv != (mpt_data_converter_t)0x0) {
            *(char **)conv = pcVar3;
          }
          val_local._4_4_ = 4;
        }
        else {
          val_local._4_4_ = -3;
        }
      }
    }
    else {
      val_local._4_4_ = 3;
      if (*(void **)(type_local + 8) == dest_local) {
        val_local._4_4_ = 0;
      }
    }
  }
  return val_local._4_4_;
}

Assistant:

extern int mpt_value_convert(const MPT_STRUCT(value) *val, MPT_TYPE(type) type, void *dest)
{
	MPT_TYPE(data_converter) conv;
	const void *src = val->_addr;
	int ret;
	
	if (!type) {
		return MPT_ERROR(BadArgument);
	}
	/* try specialized converter for type */
	if ((conv = mpt_data_converter(val->_type))) {
		if ((ret = conv(src, type, dest)) >= 0) {
			return val->_type == type ? 0 : 3;
		}
	}
	/* exact primitive type match */
	if (val->_type == type) {
		const MPT_STRUCT(type_traits) *traits;
		if (!(traits = mpt_type_traits(type))) {
			return MPT_ERROR(BadArgument);
		}
		/* no raw copy for complex types */
		if (traits->init || traits->fini) {
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			memcpy(dest, src, traits->size);
		}
		return 0;
	}
	/* vector source and genric target */
	if (type == MPT_ENUM(TypeVector)
	 && ((ret = MPT_type_toScalar(val->_type)) > 0)) {
		const MPT_STRUCT(type_traits) *traits;
		if (!(traits = mpt_type_traits(ret))) {
			return MPT_ERROR(BadArgument);
		}
		/* content of generic vector must be primitive */
		if (traits->init || traits->fini) {
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			memcpy(dest, src, sizeof(struct iovec));
		}
		return 1;
	}
	/* map to vector of same type with single element */
	if (type == MPT_type_toVector(val->_type)) {
		const MPT_STRUCT(type_traits) *traits;
		struct iovec *vec;
		if (!(traits = mpt_type_traits(val->_type))) {
			return MPT_ERROR(BadArgument);
		}
		/* convert from scalar */
		if ((vec = dest)) {
			vec->iov_base = (void *) src;
			vec->iov_len = traits->size;
		}
		return 2;
	}
	/* value represents valid string data */
	if (type == 's') {
		const char *str;
		if ((str = mpt_data_tostring(&src, val->_type, 0))) {
			if (dest) {
				*((const char **) dest) = str;
			}
			return 4;
		}
	}
	return MPT_ERROR(BadType);
}